

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::Pooling3DLayerParams::ByteSizeLong(Pooling3DLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->type_ == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->type_);
    sVar1 = sVar1 + 1;
  }
  if (this->kerneldepth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->kerneldepth_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->kernelheight_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->kernelheight_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->kernelwidth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->kernelwidth_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->stridedepth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->stridedepth_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->strideheight_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->strideheight_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->stridewidth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->stridewidth_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->custompaddingfront_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingfront_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->custompaddingback_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingback_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->custompaddingtop_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingtop_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->custompaddingbottom_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingbottom_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->custompaddingleft_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingleft_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->custompaddingright_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingright_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  sVar2 = sVar1 + 2;
  if (this->countexcludepadding_ == false) {
    sVar2 = sVar1;
  }
  if (this->paddingtype_ != 0) {
    sVar1 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->paddingtype_);
    sVar2 = sVar2 + sVar1 + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t Pooling3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Pooling3DLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // int32 kernelDepth = 2;
  if (this->kerneldepth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kerneldepth());
  }

  // int32 kernelHeight = 3;
  if (this->kernelheight() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelheight());
  }

  // int32 kernelWidth = 4;
  if (this->kernelwidth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelwidth());
  }

  // int32 strideDepth = 5;
  if (this->stridedepth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridedepth());
  }

  // int32 strideHeight = 6;
  if (this->strideheight() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->strideheight());
  }

  // int32 strideWidth = 7;
  if (this->stridewidth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridewidth());
  }

  // int32 customPaddingFront = 8;
  if (this->custompaddingfront() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingfront());
  }

  // int32 customPaddingBack = 9;
  if (this->custompaddingback() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingback());
  }

  // int32 customPaddingTop = 10;
  if (this->custompaddingtop() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingtop());
  }

  // int32 customPaddingBottom = 11;
  if (this->custompaddingbottom() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingbottom());
  }

  // int32 customPaddingLeft = 12;
  if (this->custompaddingleft() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingleft());
  }

  // int32 customPaddingRight = 13;
  if (this->custompaddingright() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingright());
  }

  // bool countExcludePadding = 14;
  if (this->countexcludepadding() != 0) {
    total_size += 1 + 1;
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->paddingtype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->paddingtype());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}